

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PatchVertexCountCase::init
          (PatchVertexCountCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  RenderTarget *renderTarget;
  ShaderProgram *pSVar4;
  RenderContext *renderCtx;
  Context *pCVar5;
  ProgramSources *pPVar6;
  TestLog *log;
  TestError *this_00;
  char *in_RCX;
  string local_410;
  ShaderSource local_3f0;
  string local_3c8;
  ShaderSource local_3a8;
  string local_380;
  ShaderSource local_360;
  string local_338;
  ShaderSource local_318;
  ProgramSources local_2f0;
  SharedPtr<const_glu::ShaderProgram> local_220;
  allocator<char> local_209;
  string local_208 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string tessellationEvaluationTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string tessellationControlTemplate;
  string local_80 [8];
  string vertexShaderTemplate;
  undefined1 local_50 [8];
  string outSizeStr;
  string inSizeStr;
  PatchVertexCountCase *this_local;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  de::toString<int>((string *)((long)&outSizeStr.field_2 + 8),&this->m_inputPatchSize);
  de::toString<int>((string *)local_50,&this->m_outputPatchSize);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\n\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,(allocator<char> *)(tessellationControlTemplate.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(tessellationControlTemplate.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tessellationEvaluationTemplate.field_2 + 8),
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::operator+(&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tessellationEvaluationTemplate.field_2 + 8),
                 ") out;\n\nin highp float in_tc_attr[];\n\nout highp float in_te_attr[];\n\nvoid main (void)\n{\n\tin_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID*"
                );
  std::operator+(&local_108,&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&outSizeStr.field_2 + 8));
  std::operator+(&local_e8,&local_108,"/");
  std::operator+(&local_c8,&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 &local_c8,
                 "];\n\n\tgl_TessLevelInner[0] = 5.0;\n\tgl_TessLevelInner[1] = 5.0;\n\n\tgl_TessLevelOuter[0] = 5.0;\n\tgl_TessLevelOuter[1] = 5.0;\n\tgl_TessLevelOuter[2] = 5.0;\n\tgl_TessLevelOuter[3] = 5.0;\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)(tessellationEvaluationTemplate.field_2._M_local_buf + 8))
  ;
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)((long)&fragmentShaderTemplate.field_2 + 8),
             (_anonymous_namespace_ *)&DAT_00000001,TESSPRIMITIVETYPE_TRIANGLES,SUB81(in_RCX,0));
  std::operator+(&local_1c8,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fragmentShaderTemplate.field_2 + 8));
  std::operator+(&local_1a8,&local_1c8,
                 "\nin highp float in_te_attr[];\n\nout mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\thighp float x = gl_TessCoord.x*2.0 - 1.0;\n\thighp float y = gl_TessCoord.y - in_te_attr[int(round(gl_TessCoord.x*float("
                );
  std::operator+(&local_188,&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 &local_188,
                 "-1)))];\n\tgl_Position = vec4(x, y, 0.0, 1.0);\n\tin_f_color = vec4(1.0);\n}\n");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)(fragmentShaderTemplate.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_208,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,&local_209);
  std::allocator<char>::~allocator(&local_209);
  pSVar4 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_2f0);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_338,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::VertexSource::VertexSource((VertexSource *)&local_318,&local_338);
  pPVar6 = glu::ProgramSources::operator<<(&local_2f0,&local_318);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_380,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_360,&local_380);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_360);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_3c8,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_3a8,&local_3c8);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_3a8);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_410,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_3f0,&local_410);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_3f0);
  glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,pPVar6);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_220,pSVar4);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_220);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_220);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  glu::VertexSource::~VertexSource((VertexSource *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  glu::ProgramSources::~ProgramSources(&local_2f0);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&this->m_program);
  glu::operator<<(log,pSVar4);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  bVar2 = glu::ShaderProgram::isOk(pSVar4);
  if (!bVar2) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0xbb2);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)local_50);
  iVar3 = std::__cxx11::string::~string((string *)(outSizeStr.field_2._M_local_buf + 8));
  return iVar3;
}

Assistant:

void PatchVertexCountCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const string inSizeStr		= de::toString(m_inputPatchSize);
	const string outSizeStr		= de::toString(m_outputPatchSize);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp float in_v_attr;\n"
													 "\n"
													 "out highp float in_tc_attr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = " + outSizeStr + ") out;\n"
													 "\n"
													 "in highp float in_tc_attr[];\n"
													 "\n"
													 "out highp float in_te_attr[];\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID*" + inSizeStr + "/" + outSizeStr + "];\n"
													 "\n"
													 "	gl_TessLevelInner[0] = 5.0;\n"
													 "	gl_TessLevelInner[1] = 5.0;\n"
													 "\n"
													"	gl_TessLevelOuter[0] = 5.0;\n"
													"	gl_TessLevelOuter[1] = 5.0;\n"
													"	gl_TessLevelOuter[2] = 5.0;\n"
													"	gl_TessLevelOuter[3] = 5.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_QUADS) +
													 "\n"
													 "in highp float in_te_attr[];\n"
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp float x = gl_TessCoord.x*2.0 - 1.0;\n"
													 "	highp float y = gl_TessCoord.y - in_te_attr[int(round(gl_TessCoord.x*float(" + outSizeStr + "-1)))];\n"
													 "	gl_Position = vec4(x, y, 0.0, 1.0);\n"
													 "	in_f_color = vec4(1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}